

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

void __thiscall re2::BitState::BitState(BitState *this,Prog *prog)

{
  this->prog_ = prog;
  this->submatch_ = (StringPiece *)0x0;
  this->nsubmatch_ = 0;
  (this->text_).data_ = (const_pointer)0x0;
  (this->text_).size_ = 0;
  (this->context_).data_ = (const_pointer)0x0;
  (this->context_).size_ = 0;
  *(undefined4 *)((long)&(this->context_).size_ + 7) = 0;
  *(undefined8 *)
   &(this->visited_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter> = 0;
  (this->visited_).ptr_._M_t.
  super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  *(undefined8 *)
   &(this->cap_).ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
    ._M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter> = 0;
  (this->cap_).ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  *(undefined8 *)
   &(this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter> = 0;
  (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
  super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl = (Job *)0x0;
  this->njob_ = 0;
  return;
}

Assistant:

BitState::BitState(Prog* prog)
  : prog_(prog),
    anchored_(false),
    longest_(false),
    endmatch_(false),
    submatch_(NULL),
    nsubmatch_(0),
    njob_(0) {
}